

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerMSL::SampledImageScanner::handle
          (SampledImageScanner *this,Op opcode,uint32_t *args,uint32_t length)

{
  bool bVar1;
  undefined4 in_EAX;
  SPIRType *pSVar2;
  bool bVar3;
  bool bVar4;
  CompilerMSL *this_00;
  uint32_t result_type;
  undefined4 uStack_28;
  uint local_24;
  
  if (opcode - OpImageSampleImplicitLod < 0xb) {
    this_00 = this->compiler;
    bVar4 = true;
    if (this_00->has_sampled_images == false) {
      pSVar2 = Compiler::expression_type((Compiler *)this_00,args[2]);
      bVar1 = Compiler::is_sampled_image_type((Compiler *)this_00,pSVar2);
      this_00 = this->compiler;
    }
    else {
      bVar1 = true;
    }
    this_00->has_sampled_images = bVar1;
    bVar3 = true;
    if (this_00->needs_swizzle_buffer_def == false) {
      bVar3 = bVar1;
    }
    this_00->needs_swizzle_buffer_def = bVar3;
  }
  else {
    bVar4 = true;
    if ((opcode - OpLoad < 0x28) && ((0x8002000001U >> ((ulong)(opcode - OpLoad) & 0x3f) & 1) != 0))
    {
      if (length < 3) {
        bVar4 = false;
      }
      else {
        _uStack_28 = CONCAT44(*args,in_EAX);
        pSVar2 = Variant::get<spirv_cross::SPIRType>
                           ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr + *args);
        if (((pSVar2->basetype & ~Void) == Image) && ((pSVar2->image).sampled == 1)) {
          uStack_28 = CONCAT13(1,(undefined3)uStack_28);
          Compiler::set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
                    ((Compiler *)this->compiler,args[1],(char (*) [1])0x3dee59,&local_24,
                     (bool *)((long)&uStack_28 + 3));
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool CompilerMSL::SampledImageScanner::handle(spv::Op opcode, const uint32_t *args, uint32_t length)
{
	switch (opcode)
	{
	case OpLoad:
	case OpImage:
	case OpSampledImage:
	{
		if (length < 3)
			return false;

		uint32_t result_type = args[0];
		auto &type = compiler.get<SPIRType>(result_type);
		if ((type.basetype != SPIRType::Image && type.basetype != SPIRType::SampledImage) || type.image.sampled != 1)
			return true;

		uint32_t id = args[1];
		compiler.set<SPIRExpression>(id, "", result_type, true);
		break;
	}
	case OpImageSampleExplicitLod:
	case OpImageSampleProjExplicitLod:
	case OpImageSampleDrefExplicitLod:
	case OpImageSampleProjDrefExplicitLod:
	case OpImageSampleImplicitLod:
	case OpImageSampleProjImplicitLod:
	case OpImageSampleDrefImplicitLod:
	case OpImageSampleProjDrefImplicitLod:
	case OpImageFetch:
	case OpImageGather:
	case OpImageDrefGather:
		compiler.has_sampled_images =
		    compiler.has_sampled_images || compiler.is_sampled_image_type(compiler.expression_type(args[2]));
		compiler.needs_swizzle_buffer_def = compiler.needs_swizzle_buffer_def || compiler.has_sampled_images;
		break;
	default:
		break;
	}
	return true;
}